

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::
SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::Required<Fixpp::TagT<23u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<28u,Fixpp::Type::Char>>,Fixpp::TagT<26u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<27u,Fixpp::Type::String>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<62u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<25u,Fixpp::Type::Char>,Fixpp::TagT<130u,Fixpp::Type::Boolean>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<199u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<104u,Fixpp::Type::Char>>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<215u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<216u,Fixpp::Type::Int>,Fixpp::TagT<217u,Fixpp::Type::String>>,Fixpp::TagT<218u,Fixpp::Type::Float>,Fixpp::TagT<219u,Fixpp::Type::Char>>::Unparsed>
::emplace_back<int&,std::pair<char_const*,unsigned_long>>
          (SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::Required<Fixpp::TagT<23u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<28u,Fixpp::Type::Char>>,Fixpp::TagT<26u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::TagT<65u,Fixpp::Type::String>,Fixpp::TagT<48u,Fixpp::Type::String>,Fixpp::TagT<22u,Fixpp::Type::String>,Fixpp::TagT<167u,Fixpp::Type::String>,Fixpp::TagT<200u,Fixpp::Type::String>,Fixpp::TagT<205u,Fixpp::Type::Int>,Fixpp::TagT<201u,Fixpp::Type::Int>,Fixpp::TagT<202u,Fixpp::Type::Float>,Fixpp::TagT<206u,Fixpp::Type::Char>,Fixpp::TagT<231u,Fixpp::Type::Float>,Fixpp::TagT<223u,Fixpp::Type::Float>,Fixpp::TagT<207u,Fixpp::Type::String>,Fixpp::TagT<106u,Fixpp::Type::String>,Fixpp::TagT<348u,Fixpp::Type::Int>,Fixpp::TagT<349u,Fixpp::Type::Data>,Fixpp::TagT<107u,Fixpp::Type::String>,Fixpp::TagT<350u,Fixpp::Type::Int>,Fixpp::TagT<351u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<54u,Fixpp::Type::Char>>,Fixpp::Required<Fixpp::TagT<27u,Fixpp::Type::String>>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<15u,Fixpp::Type::String>,Fixpp::TagT<62u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<25u,Fixpp::Type::Char>,Fixpp::TagT<130u,Fixpp::Type::Boolean>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<199u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<104u,Fixpp::Type::Char>>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>,Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<149u,Fixpp::Type::String>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<215u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<216u,Fixpp::Type::Int>,Fixpp::TagT<217u,Fixpp::Type::String>>,Fixpp::TagT<218u,Fixpp::Type::Float>,Fixpp::TagT<219u,Fixpp::Type::Char>>::Unparsed>
           *this,int *Args,pair<const_char_*,_unsigned_long> *Args_1)

{
  unsigned_long uVar1;
  int *piVar2;
  
  piVar2 = *(int **)(this + 8);
  if (*(int **)(this + 0x10) <= piVar2) {
    SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed,_false>
    ::grow((SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<23U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<28U,_Fixpp::Type::Char>_>,_Fixpp::TagT<26U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::TagT<65U,_Fixpp::Type::String>,_Fixpp::TagT<48U,_Fixpp::Type::String>,_Fixpp::TagT<22U,_Fixpp::Type::String>,_Fixpp::TagT<167U,_Fixpp::Type::String>,_Fixpp::TagT<200U,_Fixpp::Type::String>,_Fixpp::TagT<205U,_Fixpp::Type::Int>,_Fixpp::TagT<201U,_Fixpp::Type::Int>,_Fixpp::TagT<202U,_Fixpp::Type::Float>,_Fixpp::TagT<206U,_Fixpp::Type::Char>,_Fixpp::TagT<231U,_Fixpp::Type::Float>,_Fixpp::TagT<223U,_Fixpp::Type::Float>,_Fixpp::TagT<207U,_Fixpp::Type::String>,_Fixpp::TagT<106U,_Fixpp::Type::String>,_Fixpp::TagT<348U,_Fixpp::Type::Int>,_Fixpp::TagT<349U,_Fixpp::Type::Data>,_Fixpp::TagT<107U,_Fixpp::Type::String>,_Fixpp::TagT<350U,_Fixpp::Type::Int>,_Fixpp::TagT<351U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::Required<Fixpp::TagT<27U,_Fixpp::Type::String>_>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<15U,_Fixpp::Type::String>,_Fixpp::TagT<62U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<25U,_Fixpp::Type::Char>,_Fixpp::TagT<130U,_Fixpp::Type::Boolean>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<199U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<104U,_Fixpp::Type::Char>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>,_Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<149U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<215U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<216U,_Fixpp::Type::Int>,_Fixpp::TagT<217U,_Fixpp::Type::String>_>,_Fixpp::TagT<218U,_Fixpp::Type::Float>,_Fixpp::TagT<219U,_Fixpp::Type::Char>_>::Unparsed,_false>
            *)this,0);
    piVar2 = *(int **)(this + 8);
  }
  *piVar2 = *Args;
  uVar1 = Args_1->second;
  *(char **)(piVar2 + 2) = Args_1->first;
  *(unsigned_long *)(piVar2 + 4) = uVar1;
  *(long *)(this + 8) = *(long *)(this + 8) + 0x18;
  return;
}

Assistant:

void emplace_back(ArgTypes &&... Args) {
    if (LLVM_UNLIKELY(this->EndX >= this->CapacityX))
      this->grow();
    ::new ((void *)this->end()) T(std::forward<ArgTypes>(Args)...);
    this->setEnd(this->end() + 1);
  }